

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  unsigned_long *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  int iVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  ulong uVar14;
  bool bVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  string_t *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar16 = 0;
      do {
        uVar12 = uVar16;
        if (psVar2 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar2[uVar16];
        }
        uVar14 = uVar16;
        if (psVar3 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar3[uVar16];
        }
        uVar4 = *(ulong *)&ldata[uVar12].value;
        if (uVar4 == *(ulong *)&rdata[uVar14].value) {
          pcVar5 = ldata[uVar12].value.pointer.ptr;
          pcVar6 = rdata[uVar14].value.pointer.ptr;
          bVar15 = true;
          if ((pcVar5 != pcVar6) &&
             (((uint)uVar4 < 0xd || (iVar11 = bcmp(pcVar5,pcVar6,uVar4 & 0xffffffff), iVar11 != 0)))
             ) goto LAB_0034cca5;
        }
        else {
LAB_0034cca5:
          bVar15 = false;
        }
        result_data[uVar16] = bVar15;
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar16 = 0;
    local_40 = rdata;
    do {
      uVar12 = uVar16;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar16];
      }
      uVar14 = uVar16;
      if (psVar3 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar3[uVar16];
      }
      puVar7 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar7 == (unsigned_long *)0x0) || ((puVar7[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
         && ((puVar7 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))
         ) {
        uVar4 = *(ulong *)&ldata[uVar12].value;
        if (uVar4 == *(ulong *)&rdata[uVar14].value) {
          pcVar5 = ldata[uVar12].value.pointer.ptr;
          pcVar6 = rdata[uVar14].value.pointer.ptr;
          bVar15 = true;
          if ((pcVar5 != pcVar6) &&
             (((uint)uVar4 < 0xd || (iVar11 = bcmp(pcVar5,pcVar6,uVar4 & 0xffffffff), iVar11 != 0)))
             ) goto LAB_0034cd77;
        }
        else {
LAB_0034cd77:
          bVar15 = false;
        }
        result_data[uVar16] = bVar15;
        rdata = local_40;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var10 = p_Stack_50;
          peVar9 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar16 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar16 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}